

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__create_png_image_raw
              (stbi__png *a,stbi_uc *raw,stbi__uint32 raw_len,int out_n,stbi__uint32 x,
              stbi__uint32 y,int depth,int color)

{
  byte bVar1;
  stbi_uc sVar2;
  int iVar3;
  stbi__context *psVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  stbi_uc *psVar11;
  bool bVar12;
  stbi__uint16 *local_a8;
  stbi__uint16 *cur16;
  stbi_uc *cur_2;
  int q;
  stbi_uc scale;
  stbi_uc *in;
  stbi_uc *cur_1;
  int nk;
  int filter;
  stbi_uc *prior;
  stbi_uc *cur;
  int width;
  int filter_bytes;
  int output_bytes;
  int img_n;
  int k;
  stbi__uint32 img_width_bytes;
  stbi__uint32 img_len;
  stbi__uint32 stride;
  stbi__uint32 j;
  stbi__uint32 i;
  stbi__context *s;
  int bytes;
  stbi__uint32 y_local;
  stbi__uint32 x_local;
  int out_n_local;
  stbi__uint32 raw_len_local;
  stbi_uc *raw_local;
  stbi__png *a_local;
  
  iVar9 = 1;
  if (depth == 0x10) {
    iVar9 = 2;
  }
  psVar4 = a->s;
  uVar5 = x * out_n * iVar9;
  iVar3 = psVar4->img_n;
  iVar6 = out_n * iVar9;
  cur._4_4_ = iVar3 * iVar9;
  bVar12 = true;
  if (out_n != psVar4->img_n) {
    bVar12 = out_n == psVar4->img_n + 1;
  }
  if (bVar12) {
    psVar11 = (stbi_uc *)stbi__malloc((ulong)(x * y * iVar6));
    a->out = psVar11;
    if (a->out == (stbi_uc *)0x0) {
      a_local._4_4_ = stbi__err("outofmem");
    }
    else {
      uVar7 = iVar3 * x * depth + 7 >> 3;
      uVar8 = (uVar7 + 1) * y;
      if ((psVar4->img_x == x) && (psVar4->img_y == y)) {
        if (raw_len != uVar8) {
          iVar9 = stbi__err("not enough pixels");
          return iVar9;
        }
      }
      else if (raw_len < uVar8) {
        iVar9 = stbi__err("not enough pixels");
        return iVar9;
      }
      cur._0_4_ = x;
      _out_n_local = raw;
      for (img_len = 0; img_len < y; img_len = img_len + 1) {
        _nk = a->out + uVar5 * img_len;
        cur_1._4_4_ = (uint)*_out_n_local;
        if (4 < cur_1._4_4_) {
          iVar9 = stbi__err("invalid filter");
          return iVar9;
        }
        prior = _nk;
        if (depth < 8) {
          if (x < uVar7) {
            __assert_fail("img_width_bytes <= x",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SpexGuy[P]StupidSHTricks/include/stb/stb_image.h"
                          ,0xfc7,
                          "int stbi__create_png_image_raw(stbi__png *, stbi_uc *, stbi__uint32, int, stbi__uint32, stbi__uint32, int, int)"
                         );
          }
          prior = _nk + (x * out_n - uVar7);
          cur._4_4_ = 1;
          cur._0_4_ = uVar7;
        }
        if (img_len == 0) {
          cur_1._4_4_ = (uint)first_row_filter[(int)cur_1._4_4_];
        }
        for (output_bytes = 0; output_bytes < cur._4_4_; output_bytes = output_bytes + 1) {
          switch(cur_1._4_4_) {
          case 0:
            prior[output_bytes] = _out_n_local[(long)output_bytes + 1];
            break;
          case 1:
            prior[output_bytes] = _out_n_local[(long)output_bytes + 1];
            break;
          case 2:
            prior[output_bytes] =
                 _out_n_local[(long)output_bytes + 1] + _nk[(long)output_bytes - (ulong)uVar5];
            break;
          case 3:
            prior[output_bytes] =
                 _out_n_local[(long)output_bytes + 1] +
                 (char)((int)(uint)_nk[(long)output_bytes - (ulong)uVar5] >> 1);
            break;
          case 4:
            bVar1 = _out_n_local[(long)output_bytes + 1];
            iVar9 = stbi__paeth(0,(uint)_nk[(long)output_bytes - (ulong)uVar5],0);
            prior[output_bytes] = bVar1 + (char)iVar9;
            break;
          case 5:
            prior[output_bytes] = _out_n_local[(long)output_bytes + 1];
            break;
          case 6:
            prior[output_bytes] = _out_n_local[(long)output_bytes + 1];
          }
        }
        if (depth == 8) {
          if (iVar3 != out_n) {
            prior[iVar3] = 0xff;
          }
          _out_n_local = _out_n_local + (long)iVar3 + 1;
          prior = prior + out_n;
          _nk = _nk + ((long)out_n - (ulong)uVar5);
        }
        else if (depth == 0x10) {
          if (iVar3 != out_n) {
            prior[cur._4_4_] = 0xff;
            prior[cur._4_4_ + 1] = 0xff;
          }
          _out_n_local = _out_n_local + (long)cur._4_4_ + 1;
          prior = prior + iVar6;
          _nk = _nk + ((long)iVar6 - (ulong)uVar5);
        }
        else {
          _out_n_local = _out_n_local + 2;
          prior = prior + 1;
          _nk = _nk + (1 - (ulong)uVar5);
        }
        if ((depth < 8) || (iVar3 == out_n)) {
          iVar9 = ((stbi__uint32)cur - 1) * cur._4_4_;
          switch(cur_1._4_4_) {
          case 0:
            memcpy(prior,_out_n_local,(long)iVar9);
            break;
          case 1:
            for (output_bytes = 0; output_bytes < iVar9; output_bytes = output_bytes + 1) {
              prior[output_bytes] = _out_n_local[output_bytes] + prior[output_bytes - cur._4_4_];
            }
            break;
          case 2:
            for (output_bytes = 0; output_bytes < iVar9; output_bytes = output_bytes + 1) {
              prior[output_bytes] = _out_n_local[output_bytes] + _nk[output_bytes];
            }
            break;
          case 3:
            for (output_bytes = 0; output_bytes < iVar9; output_bytes = output_bytes + 1) {
              prior[output_bytes] =
                   _out_n_local[output_bytes] +
                   (char)((int)((uint)_nk[output_bytes] + (uint)prior[output_bytes - cur._4_4_]) >>
                         1);
            }
            break;
          case 4:
            for (output_bytes = 0; output_bytes < iVar9; output_bytes = output_bytes + 1) {
              bVar1 = _out_n_local[output_bytes];
              iVar10 = stbi__paeth((uint)prior[output_bytes - cur._4_4_],(uint)_nk[output_bytes],
                                   (uint)_nk[output_bytes - cur._4_4_]);
              prior[output_bytes] = bVar1 + (char)iVar10;
            }
            break;
          case 5:
            for (output_bytes = 0; output_bytes < iVar9; output_bytes = output_bytes + 1) {
              prior[output_bytes] =
                   _out_n_local[output_bytes] +
                   (char)((int)(uint)prior[output_bytes - cur._4_4_] >> 1);
            }
            break;
          case 6:
            for (output_bytes = 0; output_bytes < iVar9; output_bytes = output_bytes + 1) {
              bVar1 = _out_n_local[output_bytes];
              iVar10 = stbi__paeth((uint)prior[output_bytes - cur._4_4_],0,0);
              prior[output_bytes] = bVar1 + (char)iVar10;
            }
          }
          _out_n_local = _out_n_local + iVar9;
        }
        else {
          if (iVar3 + 1 != out_n) {
            __assert_fail("img_n+1 == out_n",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SpexGuy[P]StupidSHTricks/include/stb/stb_image.h"
                          ,0x1004,
                          "int stbi__create_png_image_raw(stbi__png *, stbi_uc *, stbi__uint32, int, stbi__uint32, stbi__uint32, int, int)"
                         );
          }
          switch(cur_1._4_4_) {
          case 0:
            stride = x - 1;
            while (stride != 0) {
              for (output_bytes = 0; output_bytes < cur._4_4_; output_bytes = output_bytes + 1) {
                prior[output_bytes] = _out_n_local[output_bytes];
              }
              stride = stride - 1;
              prior[cur._4_4_] = 0xff;
              _out_n_local = _out_n_local + cur._4_4_;
              prior = prior + iVar6;
            }
            break;
          case 1:
            stride = x - 1;
            while (stride != 0) {
              for (output_bytes = 0; output_bytes < cur._4_4_; output_bytes = output_bytes + 1) {
                prior[output_bytes] = _out_n_local[output_bytes] + prior[output_bytes - iVar6];
              }
              stride = stride - 1;
              prior[cur._4_4_] = 0xff;
              _out_n_local = _out_n_local + cur._4_4_;
              prior = prior + iVar6;
            }
            break;
          case 2:
            stride = x - 1;
            while (stride != 0) {
              for (output_bytes = 0; output_bytes < cur._4_4_; output_bytes = output_bytes + 1) {
                prior[output_bytes] = _out_n_local[output_bytes] + _nk[output_bytes];
              }
              stride = stride - 1;
              prior[cur._4_4_] = 0xff;
              _out_n_local = _out_n_local + cur._4_4_;
              prior = prior + iVar6;
              _nk = _nk + iVar6;
            }
            break;
          case 3:
            stride = x - 1;
            while (stride != 0) {
              for (output_bytes = 0; output_bytes < cur._4_4_; output_bytes = output_bytes + 1) {
                prior[output_bytes] =
                     _out_n_local[output_bytes] +
                     (char)((int)((uint)_nk[output_bytes] + (uint)prior[output_bytes - iVar6]) >> 1)
                ;
              }
              stride = stride - 1;
              prior[cur._4_4_] = 0xff;
              _out_n_local = _out_n_local + cur._4_4_;
              prior = prior + iVar6;
              _nk = _nk + iVar6;
            }
            break;
          case 4:
            stride = x - 1;
            while (stride != 0) {
              for (output_bytes = 0; output_bytes < cur._4_4_; output_bytes = output_bytes + 1) {
                bVar1 = _out_n_local[output_bytes];
                iVar9 = stbi__paeth((uint)prior[output_bytes - iVar6],(uint)_nk[output_bytes],
                                    (uint)_nk[output_bytes - iVar6]);
                prior[output_bytes] = bVar1 + (char)iVar9;
              }
              stride = stride - 1;
              prior[cur._4_4_] = 0xff;
              _out_n_local = _out_n_local + cur._4_4_;
              prior = prior + iVar6;
              _nk = _nk + iVar6;
            }
            break;
          case 5:
            stride = x - 1;
            while (stride != 0) {
              for (output_bytes = 0; output_bytes < cur._4_4_; output_bytes = output_bytes + 1) {
                prior[output_bytes] =
                     _out_n_local[output_bytes] +
                     (char)((int)(uint)prior[output_bytes - iVar6] >> 1);
              }
              stride = stride - 1;
              prior[cur._4_4_] = 0xff;
              _out_n_local = _out_n_local + cur._4_4_;
              prior = prior + iVar6;
            }
            break;
          case 6:
            stride = x - 1;
            while (stride != 0) {
              for (output_bytes = 0; output_bytes < cur._4_4_; output_bytes = output_bytes + 1) {
                bVar1 = _out_n_local[output_bytes];
                iVar9 = stbi__paeth((uint)prior[output_bytes - iVar6],0,0);
                prior[output_bytes] = bVar1 + (char)iVar9;
              }
              stride = stride - 1;
              prior[cur._4_4_] = 0xff;
              _out_n_local = _out_n_local + cur._4_4_;
              prior = prior + iVar6;
            }
          }
          if (depth == 0x10) {
            prior = a->out + uVar5 * img_len;
            for (stride = 0; stride < x; stride = stride + 1) {
              prior[cur._4_4_ + 1] = 0xff;
              prior = prior + iVar6;
            }
          }
        }
      }
      if (depth < 8) {
        for (img_len = 0; img_len < y; img_len = img_len + 1) {
          in = a->out + uVar5 * img_len;
          _q = a->out + (((ulong)(x * out_n) + (ulong)(uVar5 * img_len)) - (ulong)uVar7);
          if (color == 0) {
            sVar2 = stbi__depth_scale_table[depth];
          }
          else {
            sVar2 = '\x01';
          }
          if (depth == 4) {
            for (output_bytes = x * iVar3; 1 < output_bytes; output_bytes = output_bytes + -2) {
              psVar11 = in + 1;
              *in = sVar2 * (char)((int)(uint)*_q >> 4);
              in = in + 2;
              *psVar11 = sVar2 * (*_q & 0xf);
              _q = _q + 1;
            }
            if (0 < output_bytes) {
              *in = sVar2 * (char)((int)(uint)*_q >> 4);
            }
          }
          else if (depth == 2) {
            for (output_bytes = x * iVar3; 3 < output_bytes; output_bytes = output_bytes + -4) {
              *in = sVar2 * (char)((int)(uint)*_q >> 6);
              in[1] = sVar2 * ((byte)((int)(uint)*_q >> 4) & 3);
              psVar11 = in + 3;
              in[2] = sVar2 * ((byte)((int)(uint)*_q >> 2) & 3);
              in = in + 4;
              *psVar11 = sVar2 * (*_q & 3);
              _q = _q + 1;
            }
            if (0 < output_bytes) {
              *in = sVar2 * (char)((int)(uint)*_q >> 6);
              in = in + 1;
            }
            if (1 < output_bytes) {
              *in = sVar2 * ((byte)((int)(uint)*_q >> 4) & 3);
              in = in + 1;
            }
            if (2 < output_bytes) {
              *in = sVar2 * ((byte)((int)(uint)*_q >> 2) & 3);
            }
          }
          else if (depth == 1) {
            for (output_bytes = x * iVar3; 7 < output_bytes; output_bytes = output_bytes + -8) {
              *in = sVar2 * (char)((int)(uint)*_q >> 7);
              in[1] = sVar2 * ((byte)((int)(uint)*_q >> 6) & 1);
              in[2] = sVar2 * ((byte)((int)(uint)*_q >> 5) & 1);
              in[3] = sVar2 * ((byte)((int)(uint)*_q >> 4) & 1);
              in[4] = sVar2 * ((byte)((int)(uint)*_q >> 3) & 1);
              in[5] = sVar2 * ((byte)((int)(uint)*_q >> 2) & 1);
              psVar11 = in + 7;
              in[6] = sVar2 * ((byte)((int)(uint)*_q >> 1) & 1);
              in = in + 8;
              *psVar11 = sVar2 * (*_q & 1);
              _q = _q + 1;
            }
            if (0 < output_bytes) {
              *in = sVar2 * (char)((int)(uint)*_q >> 7);
              in = in + 1;
            }
            if (1 < output_bytes) {
              *in = sVar2 * ((byte)((int)(uint)*_q >> 6) & 1);
              in = in + 1;
            }
            if (2 < output_bytes) {
              *in = sVar2 * ((byte)((int)(uint)*_q >> 5) & 1);
              in = in + 1;
            }
            if (3 < output_bytes) {
              *in = sVar2 * ((byte)((int)(uint)*_q >> 4) & 1);
              in = in + 1;
            }
            if (4 < output_bytes) {
              *in = sVar2 * ((byte)((int)(uint)*_q >> 3) & 1);
              in = in + 1;
            }
            if (5 < output_bytes) {
              *in = sVar2 * ((byte)((int)(uint)*_q >> 2) & 1);
              in = in + 1;
            }
            if (6 < output_bytes) {
              *in = sVar2 * ((byte)((int)(uint)*_q >> 1) & 1);
            }
          }
          if (iVar3 != out_n) {
            psVar11 = a->out;
            uVar8 = uVar5 * img_len;
            if (iVar3 == 1) {
              for (cur_2._0_4_ = x - 1; -1 < (int)cur_2; cur_2._0_4_ = (int)cur_2 + -1) {
                psVar11[(long)((int)cur_2 * 2 + 1) + (ulong)uVar8] = 0xff;
                psVar11[(long)((int)cur_2 << 1) + (ulong)uVar8] =
                     psVar11[(long)(int)cur_2 + (ulong)uVar8];
              }
            }
            else {
              if (iVar3 != 3) {
                __assert_fail("img_n == 3",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/SpexGuy[P]StupidSHTricks/include/stb/stb_image.h"
                              ,0x105d,
                              "int stbi__create_png_image_raw(stbi__png *, stbi_uc *, stbi__uint32, int, stbi__uint32, stbi__uint32, int, int)"
                             );
              }
              for (cur_2._0_4_ = x - 1; -1 < (int)cur_2; cur_2._0_4_ = (int)cur_2 + -1) {
                psVar11[(long)((int)cur_2 * 4 + 3) + (ulong)uVar8] = 0xff;
                psVar11[(long)((int)cur_2 * 4 + 2) + (ulong)uVar8] =
                     psVar11[(long)((int)cur_2 * 3 + 2) + (ulong)uVar8];
                psVar11[(long)((int)cur_2 * 4 + 1) + (ulong)uVar8] =
                     psVar11[(long)((int)cur_2 * 3 + 1) + (ulong)uVar8];
                psVar11[(long)((int)cur_2 << 2) + (ulong)uVar8] =
                     psVar11[(long)((int)cur_2 * 3) + (ulong)uVar8];
              }
            }
          }
        }
      }
      else if (depth == 0x10) {
        local_a8 = (stbi__uint16 *)a->out;
        cur16 = local_a8;
        for (stride = 0; stride < x * y * out_n; stride = stride + 1) {
          *local_a8 = CONCAT11((char)*cur16,*(undefined1 *)((long)cur16 + 1));
          local_a8 = local_a8 + 1;
          cur16 = cur16 + 1;
        }
      }
      a_local._4_4_ = 1;
    }
    return a_local._4_4_;
  }
  __assert_fail("out_n == s->img_n || out_n == s->img_n+1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SpexGuy[P]StupidSHTricks/include/stb/stb_image.h"
                ,0xfb2,
                "int stbi__create_png_image_raw(stbi__png *, stbi_uc *, stbi__uint32, int, stbi__uint32, stbi__uint32, int, int)"
               );
}

Assistant:

static int stbi__create_png_image_raw(stbi__png *a, stbi_uc *raw, stbi__uint32 raw_len, int out_n, stbi__uint32 x, stbi__uint32 y, int depth, int color)
{
   int bytes = (depth == 16? 2 : 1);
   stbi__context *s = a->s;
   stbi__uint32 i,j,stride = x*out_n*bytes;
   stbi__uint32 img_len, img_width_bytes;
   int k;
   int img_n = s->img_n; // copy it into a local for later

   int output_bytes = out_n*bytes;
   int filter_bytes = img_n*bytes;
   int width = x;

   STBI_ASSERT(out_n == s->img_n || out_n == s->img_n+1);
   a->out = (stbi_uc *) stbi__malloc(x * y * output_bytes); // extra bytes to write off the end into
   if (!a->out) return stbi__err("outofmem", "Out of memory");

   img_width_bytes = (((img_n * x * depth) + 7) >> 3);
   img_len = (img_width_bytes + 1) * y;
   if (s->img_x == x && s->img_y == y) {
      if (raw_len != img_len) return stbi__err("not enough pixels","Corrupt PNG");
   } else { // interlaced:
      if (raw_len < img_len) return stbi__err("not enough pixels","Corrupt PNG");
   }

   for (j=0; j < y; ++j) {
      stbi_uc *cur = a->out + stride*j;
      stbi_uc *prior = cur - stride;
      int filter = *raw++;

      if (filter > 4)
         return stbi__err("invalid filter","Corrupt PNG");

      if (depth < 8) {
         STBI_ASSERT(img_width_bytes <= x);
         cur += x*out_n - img_width_bytes; // store output to the rightmost img_len bytes, so we can decode in place
         filter_bytes = 1;
         width = img_width_bytes;
      }

      // if first row, use special filter that doesn't sample previous row
      if (j == 0) filter = first_row_filter[filter];

      // handle first byte explicitly
      for (k=0; k < filter_bytes; ++k) {
         switch (filter) {
            case STBI__F_none       : cur[k] = raw[k]; break;
            case STBI__F_sub        : cur[k] = raw[k]; break;
            case STBI__F_up         : cur[k] = STBI__BYTECAST(raw[k] + prior[k]); break;
            case STBI__F_avg        : cur[k] = STBI__BYTECAST(raw[k] + (prior[k]>>1)); break;
            case STBI__F_paeth      : cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(0,prior[k],0)); break;
            case STBI__F_avg_first  : cur[k] = raw[k]; break;
            case STBI__F_paeth_first: cur[k] = raw[k]; break;
         }
      }

      if (depth == 8) {
         if (img_n != out_n)
            cur[img_n] = 255; // first pixel
         raw += img_n;
         cur += out_n;
         prior += out_n;
      } else if (depth == 16) {
         if (img_n != out_n) {
            cur[filter_bytes]   = 255; // first pixel top byte
            cur[filter_bytes+1] = 255; // first pixel bottom byte
         }
         raw += filter_bytes;
         cur += output_bytes;
         prior += output_bytes;
      } else {
         raw += 1;
         cur += 1;
         prior += 1;
      }

      // this is a little gross, so that we don't switch per-pixel or per-component
      if (depth < 8 || img_n == out_n) {
         int nk = (width - 1)*filter_bytes;
         #define CASE(f) \
             case f:     \
                for (k=0; k < nk; ++k)
         switch (filter) {
            // "none" filter turns into a memcpy here; make that explicit.
            case STBI__F_none:         memcpy(cur, raw, nk); break;
            CASE(STBI__F_sub)          cur[k] = STBI__BYTECAST(raw[k] + cur[k-filter_bytes]); break;
            CASE(STBI__F_up)           cur[k] = STBI__BYTECAST(raw[k] + prior[k]); break;
            CASE(STBI__F_avg)          cur[k] = STBI__BYTECAST(raw[k] + ((prior[k] + cur[k-filter_bytes])>>1)); break;
            CASE(STBI__F_paeth)        cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k-filter_bytes],prior[k],prior[k-filter_bytes])); break;
            CASE(STBI__F_avg_first)    cur[k] = STBI__BYTECAST(raw[k] + (cur[k-filter_bytes] >> 1)); break;
            CASE(STBI__F_paeth_first)  cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k-filter_bytes],0,0)); break;
         }
         #undef CASE
         raw += nk;
      } else {
         STBI_ASSERT(img_n+1 == out_n);
         #define CASE(f) \
             case f:     \
                for (i=x-1; i >= 1; --i, cur[filter_bytes]=255,raw+=filter_bytes,cur+=output_bytes,prior+=output_bytes) \
                   for (k=0; k < filter_bytes; ++k)
         switch (filter) {
            CASE(STBI__F_none)         cur[k] = raw[k]; break;
            CASE(STBI__F_sub)          cur[k] = STBI__BYTECAST(raw[k] + cur[k- output_bytes]); break;
            CASE(STBI__F_up)           cur[k] = STBI__BYTECAST(raw[k] + prior[k]); break;
            CASE(STBI__F_avg)          cur[k] = STBI__BYTECAST(raw[k] + ((prior[k] + cur[k- output_bytes])>>1)); break;
            CASE(STBI__F_paeth)        cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k- output_bytes],prior[k],prior[k- output_bytes])); break;
            CASE(STBI__F_avg_first)    cur[k] = STBI__BYTECAST(raw[k] + (cur[k- output_bytes] >> 1)); break;
            CASE(STBI__F_paeth_first)  cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k- output_bytes],0,0)); break;
         }
         #undef CASE

         // the loop above sets the high byte of the pixels' alpha, but for
         // 16 bit png files we also need the low byte set. we'll do that here.
         if (depth == 16) {
            cur = a->out + stride*j; // start at the beginning of the row again
            for (i=0; i < x; ++i,cur+=output_bytes) {
               cur[filter_bytes+1] = 255;
            }
         }
      }
   }

   // we make a separate pass to expand bits to pixels; for performance,
   // this could run two scanlines behind the above code, so it won't
   // intefere with filtering but will still be in the cache.
   if (depth < 8) {
      for (j=0; j < y; ++j) {
         stbi_uc *cur = a->out + stride*j;
         stbi_uc *in  = a->out + stride*j + x*out_n - img_width_bytes;
         // unpack 1/2/4-bit into a 8-bit buffer. allows us to keep the common 8-bit path optimal at minimal cost for 1/2/4-bit
         // png guarante byte alignment, if width is not multiple of 8/4/2 we'll decode dummy trailing data that will be skipped in the later loop
         stbi_uc scale = (color == 0) ? stbi__depth_scale_table[depth] : 1; // scale grayscale values to 0..255 range

         // note that the final byte might overshoot and write more data than desired.
         // we can allocate enough data that this never writes out of memory, but it
         // could also overwrite the next scanline. can it overwrite non-empty data
         // on the next scanline? yes, consider 1-pixel-wide scanlines with 1-bit-per-pixel.
         // so we need to explicitly clamp the final ones

         if (depth == 4) {
            for (k=x*img_n; k >= 2; k-=2, ++in) {
               *cur++ = scale * ((*in >> 4)       );
               *cur++ = scale * ((*in     ) & 0x0f);
            }
            if (k > 0) *cur++ = scale * ((*in >> 4)       );
         } else if (depth == 2) {
            for (k=x*img_n; k >= 4; k-=4, ++in) {
               *cur++ = scale * ((*in >> 6)       );
               *cur++ = scale * ((*in >> 4) & 0x03);
               *cur++ = scale * ((*in >> 2) & 0x03);
               *cur++ = scale * ((*in     ) & 0x03);
            }
            if (k > 0) *cur++ = scale * ((*in >> 6)       );
            if (k > 1) *cur++ = scale * ((*in >> 4) & 0x03);
            if (k > 2) *cur++ = scale * ((*in >> 2) & 0x03);
         } else if (depth == 1) {
            for (k=x*img_n; k >= 8; k-=8, ++in) {
               *cur++ = scale * ((*in >> 7)       );
               *cur++ = scale * ((*in >> 6) & 0x01);
               *cur++ = scale * ((*in >> 5) & 0x01);
               *cur++ = scale * ((*in >> 4) & 0x01);
               *cur++ = scale * ((*in >> 3) & 0x01);
               *cur++ = scale * ((*in >> 2) & 0x01);
               *cur++ = scale * ((*in >> 1) & 0x01);
               *cur++ = scale * ((*in     ) & 0x01);
            }
            if (k > 0) *cur++ = scale * ((*in >> 7)       );
            if (k > 1) *cur++ = scale * ((*in >> 6) & 0x01);
            if (k > 2) *cur++ = scale * ((*in >> 5) & 0x01);
            if (k > 3) *cur++ = scale * ((*in >> 4) & 0x01);
            if (k > 4) *cur++ = scale * ((*in >> 3) & 0x01);
            if (k > 5) *cur++ = scale * ((*in >> 2) & 0x01);
            if (k > 6) *cur++ = scale * ((*in >> 1) & 0x01);
         }
         if (img_n != out_n) {
            int q;
            // insert alpha = 255
            cur = a->out + stride*j;
            if (img_n == 1) {
               for (q=x-1; q >= 0; --q) {
                  cur[q*2+1] = 255;
                  cur[q*2+0] = cur[q];
               }
            } else {
               STBI_ASSERT(img_n == 3);
               for (q=x-1; q >= 0; --q) {
                  cur[q*4+3] = 255;
                  cur[q*4+2] = cur[q*3+2];
                  cur[q*4+1] = cur[q*3+1];
                  cur[q*4+0] = cur[q*3+0];
               }
            }
         }
      }
   } else if (depth == 16) {
      // force the image data from big-endian to platform-native.
      // this is done in a separate pass due to the decoding relying
      // on the data being untouched, but could probably be done
      // per-line during decode if care is taken.
      stbi_uc *cur = a->out;
      stbi__uint16 *cur16 = (stbi__uint16*)cur;

      for(i=0; i < x*y*out_n; ++i,cur16++,cur+=2) {
         *cur16 = (cur[0] << 8) | cur[1];
      }
   }

   return 1;
}